

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O3

void __thiscall
MODEL3D::three_dim_model::generate_freecad_solid
          (three_dim_model *this,Paths *primary,Paths *secondary,bool *has_holes,int *layer_number,
          int *mask_type)

{
  map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
  *pmVar1;
  double *overlap_factor;
  map<int,_std::vector<GEO::point,_std::allocator<GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>_>_>
  *pmVar2;
  pointer pIVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  pointer pcVar6;
  uint uVar7;
  pointer pvVar8;
  uint uVar9;
  _Alloc_hider _Var10;
  three_dim_model *this_00;
  pointer pvVar11;
  Paths *pPVar12;
  uint uVar13;
  long *plVar14;
  undefined8 *puVar15;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  uint uVar18;
  size_type *psVar19;
  ulong *puVar20;
  pointer *ppIVar21;
  ulong *puVar22;
  Path *pPVar23;
  ulong uVar24;
  Path *pPVar25;
  pointer pvVar26;
  uint *puVar27;
  pointer pIVar28;
  undefined8 uVar29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  uint uVar31;
  string __str;
  bool bot_strt;
  string __str_9;
  string __str_1;
  string __str_2;
  string __str_3;
  string __str_4;
  string __str_5;
  double o_f;
  undefined1 local_268 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  uint *local_1e0;
  pointer *local_1d8;
  long local_1d0;
  pointer local_1c8;
  long lStack_1c0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  three_dim_model *local_190;
  ulong *local_188;
  long local_180;
  ulong local_178;
  long lStack_170;
  pointer *local_168;
  long local_160;
  pointer local_158 [2];
  pointer local_148;
  undefined1 local_140 [256];
  Paths *local_40;
  Paths *local_38;
  
  uVar7 = *layer_number;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_0014f793;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_0014f793;
      }
      if (uVar18 < 10000) goto LAB_0014f793;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_0014f793:
  local_268._0_8_ = local_268 + 0x10;
  local_190 = this;
  local_148 = (pointer)mask_type;
  local_38 = secondary;
  std::__cxx11::string::_M_construct((ulong)local_268,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_268._0_8_ + (ulong)(uVar7 >> 0x1f)),uVar31,uVar9);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)local_268,0,(char *)0x0,0x1795f7);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_240.field_2._M_allocated_capacity = *psVar19;
    local_240.field_2._8_8_ = plVar14[3];
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  }
  else {
    local_240.field_2._M_allocated_capacity = *psVar19;
    local_240._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_240._M_string_length = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_240);
  local_1b8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &local_190->py_script;
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_140._16_8_ = *psVar19;
    local_140._24_8_ = plVar14[3];
    local_140._0_8_ = local_140 + 0x10;
  }
  else {
    local_140._16_8_ = *psVar19;
    local_140._0_8_ = (size_type *)*plVar14;
  }
  local_140._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  local_1e0 = (uint *)layer_number;
  if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  this_00 = local_190;
  pPVar25 = (primary->
            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pPVar23 = (primary->
            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_40 = primary;
  if (pPVar25 != pPVar23) {
    do {
      _Var10._M_p = local_240._M_dataplus._M_p;
      local_240._M_dataplus._M_p = local_240._M_dataplus._M_p & 0xffffffffffffff00;
      local_140._0_8_ = this_00->additive_overlap_factor;
      if (*(int *)local_148 == 3) {
        local_140._0_8_ = (pointer)0x3ff0000000000000;
      }
      else if (*(int *)local_148 == 1) {
        local_240._M_dataplus._M_p._1_7_ = SUB87(_Var10._M_p,1);
        local_240._M_dataplus._M_p._0_1_ = 1;
      }
      local_268[0] = 1;
      push_freecad_pss(this_00,pPVar25,(bool *)&local_240,(int *)local_1e0,(bool *)local_268,
                       (double *)local_140);
      pPVar25 = pPVar25 + 1;
    } while (pPVar25 != pPVar23);
  }
  puVar27 = local_1e0;
  local_140[0] = 1;
  build_additive_shapes(this_00,(int *)local_1e0,(bool *)local_140);
  uVar7 = *puVar27;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_0014fa2d;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_0014fa2d;
      }
      if (uVar18 < 10000) goto LAB_0014fa2d;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_0014fa2d:
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_200,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_200._M_dataplus._M_p + (uVar7 >> 0x1f),uVar31,uVar9);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x179679);
  paVar30 = &local_220.field_2;
  psVar19 = (size_type *)(plVar14 + 2);
  puVar22 = (ulong *)(local_268 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_220.field_2._M_allocated_capacity = *psVar19;
    local_220.field_2._8_8_ = plVar14[3];
    local_220._M_dataplus._M_p = (pointer)paVar30;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar19;
    local_220._M_dataplus._M_p = (pointer)*plVar14;
  }
  paVar4 = &local_240.field_2;
  local_220._M_string_length = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_220);
  puVar20 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar20) {
    local_268._16_8_ = *puVar20;
    local_268._24_8_ = plVar14[3];
    local_268._0_8_ = puVar22;
  }
  else {
    local_268._16_8_ = *puVar20;
    local_268._0_8_ = (ulong *)*plVar14;
  }
  local_268._8_8_ = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  uVar7 = *local_1e0;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_0014fb86;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_0014fb86;
      }
      if (uVar18 < 10000) goto LAB_0014fb86;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_0014fb86:
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_1d8),uVar31,uVar9);
  pIVar3 = (pointer)((long)&(((_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               *)local_268._8_8_)->_M_impl).super__Vector_impl_data._M_start +
                    local_1d0);
  pIVar28 = (pointer)0xf;
  if ((ulong *)local_268._0_8_ != puVar22) {
    pIVar28 = (pointer)local_268._16_8_;
  }
  if (pIVar28 < pIVar3) {
    pIVar28 = (pointer)0xf;
    if (local_1d8 != &local_1c8) {
      pIVar28 = local_1c8;
    }
    if (pIVar28 < pIVar3) goto LAB_0014fc16;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,local_268._0_8_);
  }
  else {
LAB_0014fc16:
    puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_268,(ulong)local_1d8);
  }
  psVar19 = puVar15 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_240.field_2._M_allocated_capacity = *psVar19;
    local_240.field_2._8_8_ = puVar15[3];
    local_240._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_240.field_2._M_allocated_capacity = *psVar19;
    local_240._M_dataplus._M_p = (pointer)*puVar15;
  }
  local_240._M_string_length = puVar15[1];
  *puVar15 = psVar19;
  puVar15[1] = 0;
  *(undefined1 *)psVar19 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_240);
  local_140._0_8_ = local_140 + 0x10;
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_140._16_8_ = *psVar19;
    local_140._24_8_ = plVar14[3];
  }
  else {
    local_140._16_8_ = *psVar19;
    local_140._0_8_ = (size_type *)*plVar14;
  }
  local_140._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar4) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,(ulong)((long)&local_1c8->X + 1));
  }
  if ((ulong *)local_268._0_8_ != puVar22) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar30) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  uVar7 = *local_1e0;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_0014fdfa;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_0014fdfa;
      }
      if (uVar18 < 10000) goto LAB_0014fdfa;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_0014fdfa:
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1b0,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1b0._M_dataplus._M_p + (uVar7 >> 0x1f),uVar31,uVar9);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x179679);
  local_1d8 = &local_1c8;
  ppIVar21 = (pointer *)(plVar14 + 2);
  puVar22 = (ulong *)(local_268 + 0x10);
  if ((pointer *)*plVar14 == ppIVar21) {
    local_1c8 = *ppIVar21;
    lStack_1c0 = plVar14[3];
  }
  else {
    local_1c8 = *ppIVar21;
    local_1d8 = (pointer *)*plVar14;
  }
  local_1d0 = plVar14[1];
  *plVar14 = (long)ppIVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  puVar20 = (ulong *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar20) {
    local_200.field_2._M_allocated_capacity = *puVar20;
    local_200.field_2._8_8_ = plVar14[3];
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  }
  else {
    local_200.field_2._M_allocated_capacity = *puVar20;
    local_200._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_200._M_string_length = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  uVar7 = *local_1e0;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_0014ff68;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_0014ff68;
      }
      if (uVar18 < 10000) goto LAB_0014ff68;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_0014ff68:
  local_188 = &local_178;
  std::__cxx11::string::_M_construct((ulong)&local_188,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_188),uVar31,uVar9);
  uVar29 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    uVar29 = local_200.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar29 < local_180 + local_200._M_string_length) {
    uVar24 = 0xf;
    if (local_188 != &local_178) {
      uVar24 = local_178;
    }
    if (uVar24 < local_180 + local_200._M_string_length) goto LAB_0014fff9;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_188,0,(char *)0x0,(ulong)local_200._M_dataplus._M_p);
  }
  else {
LAB_0014fff9:
    puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_188);
  }
  psVar19 = puVar15 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_220.field_2._M_allocated_capacity = *psVar19;
    local_220.field_2._8_8_ = puVar15[3];
    local_220._M_dataplus._M_p = (pointer)paVar30;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar19;
    local_220._M_dataplus._M_p = (pointer)*puVar15;
  }
  local_220._M_string_length = puVar15[1];
  *puVar15 = psVar19;
  puVar15[1] = 0;
  *(undefined1 *)psVar19 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_220);
  puVar20 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar20) {
    local_268._16_8_ = *puVar20;
    local_268._24_8_ = plVar14[3];
    local_268._0_8_ = puVar22;
  }
  else {
    local_268._16_8_ = *puVar20;
    local_268._0_8_ = (ulong *)*plVar14;
  }
  local_268._8_8_ = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  uVar7 = *local_1e0;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_00150116;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_00150116;
      }
      if (uVar18 < 10000) goto LAB_00150116;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_00150116:
  local_168 = local_158;
  std::__cxx11::string::_M_construct((ulong)&local_168,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_168),uVar31,uVar9);
  pIVar3 = (pointer)((long)&(((_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               *)local_268._8_8_)->_M_impl).super__Vector_impl_data._M_start +
                    local_160);
  pIVar28 = (pointer)0xf;
  if ((ulong *)local_268._0_8_ != puVar22) {
    pIVar28 = (pointer)local_268._16_8_;
  }
  if (pIVar28 < pIVar3) {
    pIVar28 = (pointer)0xf;
    if (local_168 != local_158) {
      pIVar28 = local_158[0];
    }
    if (pIVar28 < pIVar3) goto LAB_001501a6;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,local_268._0_8_);
  }
  else {
LAB_001501a6:
    puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_268,(ulong)local_168);
  }
  psVar19 = puVar15 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_240.field_2._M_allocated_capacity = *psVar19;
    local_240.field_2._8_8_ = puVar15[3];
    local_240._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_240.field_2._M_allocated_capacity = *psVar19;
    local_240._M_dataplus._M_p = (pointer)*puVar15;
  }
  local_240._M_string_length = puVar15[1];
  *puVar15 = psVar19;
  puVar15[1] = 0;
  *(undefined1 *)psVar19 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_240);
  local_140._0_8_ = local_140 + 0x10;
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_140._16_8_ = *psVar19;
    local_140._24_8_ = plVar14[3];
  }
  else {
    local_140._16_8_ = *psVar19;
    local_140._0_8_ = (size_type *)*plVar14;
  }
  local_140._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar4) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if (local_168 != local_158) {
    operator_delete(local_168,(ulong)((long)&local_158[0]->X + 1));
  }
  if ((ulong *)local_268._0_8_ != puVar22) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar30) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,local_178 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,(ulong)((long)&local_1c8->X + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((local_38->
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (local_38->
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = *local_1e0;
    uVar9 = -uVar7;
    if (0 < (int)uVar7) {
      uVar9 = uVar7;
    }
    uVar31 = 1;
    if (9 < uVar9) {
      uVar24 = (ulong)uVar9;
      uVar13 = 4;
      do {
        uVar31 = uVar13;
        uVar18 = (uint)uVar24;
        if (uVar18 < 100) {
          uVar31 = uVar31 - 2;
          goto LAB_00150ef8;
        }
        if (uVar18 < 1000) {
          uVar31 = uVar31 - 1;
          goto LAB_00150ef8;
        }
        if (uVar18 < 10000) goto LAB_00150ef8;
        uVar24 = uVar24 / 10000;
        uVar13 = uVar31 + 4;
      } while (99999 < uVar18);
      uVar31 = uVar31 + 1;
    }
LAB_00150ef8:
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_220,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_220._M_dataplus._M_p + (uVar7 >> 0x1f),uVar31,uVar9);
    plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,0x179653);
    puVar27 = local_1e0;
    pPVar25 = (Path *)(plVar14 + 2);
    if ((Path *)*plVar14 == pPVar25) {
      local_268._16_8_ =
           (pPVar25->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_268._24_8_ = plVar14[3];
      local_268._0_8_ = (Path *)(local_268 + 0x10);
    }
    else {
      local_268._16_8_ =
           (pPVar25->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_268._0_8_ = (Path *)*plVar14;
    }
    local_268._8_8_ = plVar14[1];
    *plVar14 = (long)pPVar25;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append(local_268);
    puVar22 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar22) {
      local_240.field_2._M_allocated_capacity = *puVar22;
      local_240.field_2._8_8_ = puVar15[3];
      local_240._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_240.field_2._M_allocated_capacity = *puVar22;
      local_240._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_240._M_string_length = puVar15[1];
    *puVar15 = puVar22;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    uVar7 = *puVar27;
    uVar9 = -uVar7;
    if (0 < (int)uVar7) {
      uVar9 = uVar7;
    }
    uVar31 = 1;
    if (9 < uVar9) {
      uVar24 = (ulong)uVar9;
      uVar13 = 4;
      do {
        uVar31 = uVar13;
        uVar18 = (uint)uVar24;
        if (uVar18 < 100) {
          uVar31 = uVar31 - 2;
          goto LAB_0015103f;
        }
        if (uVar18 < 1000) {
          uVar31 = uVar31 - 1;
          goto LAB_0015103f;
        }
        if (uVar18 < 10000) goto LAB_0015103f;
        uVar24 = uVar24 / 10000;
        uVar13 = uVar31 + 4;
      } while (99999 < uVar18);
      uVar31 = uVar31 + 1;
    }
LAB_0015103f:
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_200,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_200._M_dataplus._M_p + (uVar7 >> 0x1f),uVar31,uVar9);
    puVar27 = local_1e0;
    uVar29 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar4) {
      uVar29 = local_240.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar29 < local_200._M_string_length + local_240._M_string_length) {
      uVar29 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        uVar29 = local_200.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar29 < local_200._M_string_length + local_240._M_string_length)
      goto LAB_001510bf;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_200,0,(char *)0x0,(ulong)local_240._M_dataplus._M_p);
    }
    else {
LAB_001510bf:
      puVar15 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_240,(ulong)local_200._M_dataplus._M_p);
    }
    psVar19 = puVar15 + 2;
    if ((size_type *)*puVar15 == psVar19) {
      local_140._16_8_ = *psVar19;
      local_140._24_8_ = puVar15[3];
      local_140._0_8_ = local_140 + 0x10;
    }
    else {
      local_140._16_8_ = *psVar19;
      local_140._0_8_ = (size_type *)*puVar15;
    }
    local_140._8_8_ = puVar15[1];
    *puVar15 = psVar19;
    puVar15[1] = 0;
    *(undefined1 *)psVar19 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  }
  else {
    uVar7 = *local_1e0;
    uVar9 = -uVar7;
    if (0 < (int)uVar7) {
      uVar9 = uVar7;
    }
    uVar31 = 1;
    if (9 < uVar9) {
      uVar24 = (ulong)uVar9;
      uVar13 = 4;
      do {
        uVar31 = uVar13;
        uVar18 = (uint)uVar24;
        if (uVar18 < 100) {
          uVar31 = uVar31 - 2;
          goto LAB_00150495;
        }
        if (uVar18 < 1000) {
          uVar31 = uVar31 - 1;
          goto LAB_00150495;
        }
        if (uVar18 < 10000) goto LAB_00150495;
        uVar24 = uVar24 / 10000;
        uVar13 = uVar31 + 4;
      } while (99999 < uVar18);
      uVar31 = uVar31 + 1;
    }
LAB_00150495:
    local_268._0_8_ = local_268 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_268,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_268._0_8_ + (ulong)(uVar7 >> 0x1f)),uVar31,uVar9);
    plVar14 = (long *)std::__cxx11::string::replace((ulong)local_268,0,(char *)0x0,0x17959a);
    psVar19 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_240.field_2._M_allocated_capacity = *psVar19;
      local_240.field_2._8_8_ = plVar14[3];
      local_240._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_240.field_2._M_allocated_capacity = *psVar19;
      local_240._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_240._M_string_length = plVar14[1];
    *plVar14 = (long)psVar19;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_240);
    psVar19 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar19) {
      local_140._16_8_ = *psVar19;
      local_140._24_8_ = plVar14[3];
      local_140._0_8_ = local_140 + 0x10;
    }
    else {
      local_140._16_8_ = *psVar19;
      local_140._0_8_ = (size_type *)*plVar14;
    }
    local_140._8_8_ = plVar14[1];
    *plVar14 = (long)psVar19;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
    if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
    puVar27 = local_1e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar4) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
      operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
    }
    pvVar11 = local_148;
    pvVar26 = (local_38->
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = (local_38->
             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar26 != pvVar8) {
      overlap_factor = &local_190->subtractive_overlap_factor;
      do {
        local_140[0] = *(int *)pvVar11 != 1;
        local_240._M_dataplus._M_p = local_240._M_dataplus._M_p & 0xffffffffffffff00;
        push_freecad_pss(local_190,pvVar26,(bool *)local_140,(int *)puVar27,(bool *)&local_240,
                         overlap_factor);
        pvVar26 = pvVar26 + 1;
      } while (pvVar26 != pvVar8);
    }
    build_subtractive_shapes(local_190,(int *)puVar27);
    uVar7 = *puVar27;
    uVar9 = -uVar7;
    if (0 < (int)uVar7) {
      uVar9 = uVar7;
    }
    uVar31 = 1;
    paVar30 = &local_240.field_2;
    if (9 < uVar9) {
      uVar24 = (ulong)uVar9;
      uVar13 = 4;
      do {
        uVar31 = uVar13;
        uVar18 = (uint)uVar24;
        if (uVar18 < 100) {
          uVar31 = uVar31 - 2;
          goto LAB_001506c4;
        }
        if (uVar18 < 1000) {
          uVar31 = uVar31 - 1;
          goto LAB_001506c4;
        }
        if (uVar18 < 10000) goto LAB_001506c4;
        uVar24 = uVar24 / 10000;
        uVar13 = uVar31 + 4;
      } while (99999 < uVar18);
      uVar31 = uVar31 + 1;
    }
LAB_001506c4:
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_1b0,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_1b0._M_dataplus._M_p + (uVar7 >> 0x1f),uVar31,uVar9);
    plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x1795bd);
    puVar27 = local_1e0;
    local_1d8 = &local_1c8;
    ppIVar21 = (pointer *)(plVar14 + 2);
    paVar4 = &local_200.field_2;
    if ((pointer *)*plVar14 == ppIVar21) {
      local_1c8 = *ppIVar21;
      lStack_1c0 = plVar14[3];
    }
    else {
      local_1c8 = *ppIVar21;
      local_1d8 = (pointer *)*plVar14;
    }
    pPVar25 = (Path *)(local_268 + 0x10);
    local_1d0 = plVar14[1];
    *plVar14 = (long)ppIVar21;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    puVar22 = (ulong *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar22) {
      local_200.field_2._M_allocated_capacity = *puVar22;
      local_200.field_2._8_8_ = plVar14[3];
      local_200._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_200.field_2._M_allocated_capacity = *puVar22;
      local_200._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_200._M_string_length = plVar14[1];
    *plVar14 = (long)puVar22;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    uVar7 = *puVar27;
    uVar9 = -uVar7;
    if (0 < (int)uVar7) {
      uVar9 = uVar7;
    }
    uVar31 = 1;
    if (9 < uVar9) {
      uVar24 = (ulong)uVar9;
      uVar13 = 4;
      do {
        uVar31 = uVar13;
        uVar18 = (uint)uVar24;
        if (uVar18 < 100) {
          uVar31 = uVar31 - 2;
          goto LAB_0015082b;
        }
        if (uVar18 < 1000) {
          uVar31 = uVar31 - 1;
          goto LAB_0015082b;
        }
        if (uVar18 < 10000) goto LAB_0015082b;
        uVar24 = uVar24 / 10000;
        uVar13 = uVar31 + 4;
      } while (99999 < uVar18);
      uVar31 = uVar31 + 1;
    }
LAB_0015082b:
    local_188 = &local_178;
    std::__cxx11::string::_M_construct((ulong)&local_188,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_188),uVar31,uVar9);
    puVar27 = local_1e0;
    uVar29 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar4) {
      uVar29 = local_200.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar29 < local_180 + local_200._M_string_length) {
      uVar24 = 0xf;
      if (local_188 != &local_178) {
        uVar24 = local_178;
      }
      if (uVar24 < local_180 + local_200._M_string_length) goto LAB_001508c2;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_188,0,(char *)0x0,(ulong)local_200._M_dataplus._M_p);
    }
    else {
LAB_001508c2:
      puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_188);
    }
    psVar19 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_220.field_2._M_allocated_capacity = *psVar19;
      local_220.field_2._8_8_ = puVar15[3];
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    }
    else {
      local_220.field_2._M_allocated_capacity = *psVar19;
      local_220._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_220._M_string_length = puVar15[1];
    *puVar15 = psVar19;
    puVar15[1] = 0;
    *(undefined1 *)psVar19 = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_220);
    pPVar23 = (Path *)(plVar14 + 2);
    if ((Path *)*plVar14 == pPVar23) {
      local_268._16_8_ =
           (pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_268._24_8_ = plVar14[3];
      local_268._0_8_ = pPVar25;
    }
    else {
      local_268._16_8_ =
           (pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_268._0_8_ = (Path *)*plVar14;
    }
    local_268._8_8_ = plVar14[1];
    *plVar14 = (long)pPVar23;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    uVar7 = *puVar27;
    uVar9 = -uVar7;
    if (0 < (int)uVar7) {
      uVar9 = uVar7;
    }
    uVar31 = 1;
    if (9 < uVar9) {
      uVar24 = (ulong)uVar9;
      uVar13 = 4;
      do {
        uVar31 = uVar13;
        uVar18 = (uint)uVar24;
        if (uVar18 < 100) {
          uVar31 = uVar31 - 2;
          goto LAB_001509d2;
        }
        if (uVar18 < 1000) {
          uVar31 = uVar31 - 1;
          goto LAB_001509d2;
        }
        if (uVar18 < 10000) goto LAB_001509d2;
        uVar24 = uVar24 / 10000;
        uVar13 = uVar31 + 4;
      } while (99999 < uVar18);
      uVar31 = uVar31 + 1;
    }
LAB_001509d2:
    local_168 = local_158;
    std::__cxx11::string::_M_construct((ulong)&local_168,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_168),uVar31,uVar9);
    pIVar3 = (pointer)((long)&(((_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                 *)local_268._8_8_)->_M_impl).super__Vector_impl_data._M_start +
                      local_160);
    pIVar28 = (pointer)0xf;
    if ((Path *)local_268._0_8_ != pPVar25) {
      pIVar28 = (pointer)local_268._16_8_;
    }
    if (pIVar28 < pIVar3) {
      pIVar28 = (pointer)0xf;
      if (local_168 != local_158) {
        pIVar28 = local_158[0];
      }
      if (pIVar28 < pIVar3) goto LAB_00150a70;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,local_268._0_8_);
    }
    else {
LAB_00150a70:
      puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_268,(ulong)local_168);
    }
    psVar19 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_240.field_2._M_allocated_capacity = *psVar19;
      local_240.field_2._8_8_ = puVar15[3];
      local_240._M_dataplus._M_p = (pointer)paVar30;
    }
    else {
      local_240.field_2._M_allocated_capacity = *psVar19;
      local_240._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_240._M_string_length = puVar15[1];
    *puVar15 = psVar19;
    puVar15[1] = 0;
    *(undefined1 *)psVar19 = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_240);
    psVar19 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar19) {
      local_140._16_8_ = *psVar19;
      local_140._24_8_ = plVar14[3];
      local_140._0_8_ = local_140 + 0x10;
    }
    else {
      local_140._16_8_ = *psVar19;
      local_140._0_8_ = (size_type *)*plVar14;
    }
    local_140._8_8_ = plVar14[1];
    *plVar14 = (long)psVar19;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
    if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar30) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if (local_168 != local_158) {
      operator_delete(local_168,(ulong)((long)&local_158[0]->X + 1));
    }
    if ((Path *)local_268._0_8_ != pPVar25) {
      operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar4) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,(ulong)((long)&local_1c8->X + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    uVar7 = *local_1e0;
    uVar9 = -uVar7;
    if (0 < (int)uVar7) {
      uVar9 = uVar7;
    }
    uVar31 = 1;
    if (9 < uVar9) {
      uVar24 = (ulong)uVar9;
      uVar13 = 4;
      do {
        uVar31 = uVar13;
        uVar18 = (uint)uVar24;
        if (uVar18 < 100) {
          uVar31 = uVar31 - 2;
          goto LAB_00150ca6;
        }
        if (uVar18 < 1000) {
          uVar31 = uVar31 - 1;
          goto LAB_00150ca6;
        }
        if (uVar18 < 10000) goto LAB_00150ca6;
        uVar24 = uVar24 / 10000;
        uVar13 = uVar31 + 4;
      } while (99999 < uVar18);
      uVar31 = uVar31 + 1;
    }
LAB_00150ca6:
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_220,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_220._M_dataplus._M_p + (uVar7 >> 0x1f),uVar31,uVar9);
    plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,0x179657);
    puVar27 = local_1e0;
    pPVar23 = (Path *)(plVar14 + 2);
    if ((Path *)*plVar14 == pPVar23) {
      local_268._16_8_ =
           (pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_268._24_8_ = plVar14[3];
      local_268._0_8_ = pPVar25;
    }
    else {
      local_268._16_8_ =
           (pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_268._0_8_ = (Path *)*plVar14;
    }
    local_268._8_8_ = plVar14[1];
    *plVar14 = (long)pPVar23;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append(local_268);
    puVar22 = (ulong *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar22) {
      local_240.field_2._M_allocated_capacity = *puVar22;
      local_240.field_2._8_8_ = plVar14[3];
      local_240._M_dataplus._M_p = (pointer)paVar30;
    }
    else {
      local_240.field_2._M_allocated_capacity = *puVar22;
      local_240._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_240._M_string_length = plVar14[1];
    *plVar14 = (long)puVar22;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    uVar7 = *puVar27;
    uVar9 = -uVar7;
    if (0 < (int)uVar7) {
      uVar9 = uVar7;
    }
    uVar31 = 1;
    if (9 < uVar9) {
      uVar24 = (ulong)uVar9;
      uVar13 = 4;
      do {
        uVar31 = uVar13;
        uVar18 = (uint)uVar24;
        if (uVar18 < 100) {
          uVar31 = uVar31 - 2;
          goto LAB_00150ded;
        }
        if (uVar18 < 1000) {
          uVar31 = uVar31 - 1;
          goto LAB_00150ded;
        }
        if (uVar18 < 10000) goto LAB_00150ded;
        uVar24 = uVar24 / 10000;
        uVar13 = uVar31 + 4;
      } while (99999 < uVar18);
      uVar31 = uVar31 + 1;
    }
LAB_00150ded:
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_200,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_200._M_dataplus._M_p + (uVar7 >> 0x1f),uVar31,uVar9);
    puVar27 = local_1e0;
    uVar29 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar30) {
      uVar29 = local_240.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar29 < local_200._M_string_length + local_240._M_string_length) {
      uVar29 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        uVar29 = local_200.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar29 < local_200._M_string_length + local_240._M_string_length)
      goto LAB_00150e6d;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_200,0,(char *)0x0,(ulong)local_240._M_dataplus._M_p);
    }
    else {
LAB_00150e6d:
      puVar15 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_240,(ulong)local_200._M_dataplus._M_p);
    }
    psVar19 = puVar15 + 2;
    if ((size_type *)*puVar15 == psVar19) {
      local_140._16_8_ = *psVar19;
      local_140._24_8_ = puVar15[3];
      local_140._0_8_ = local_140 + 0x10;
    }
    else {
      local_140._16_8_ = *psVar19;
      local_140._0_8_ = (size_type *)*puVar15;
    }
    local_140._8_8_ = puVar15[1];
    *puVar15 = psVar19;
    puVar15[1] = 0;
    *(undefined1 *)psVar19 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  }
  paVar30 = &local_240.field_2;
  pPVar25 = (Path *)(local_268 + 0x10);
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar30) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((Path *)local_268._0_8_ != pPVar25) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  uVar7 = *puVar27;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_00151211;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_00151211;
      }
      if (uVar18 < 10000) goto LAB_00151211;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_00151211:
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_200,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_200._M_dataplus._M_p + (uVar7 >> 0x1f),uVar31,uVar9);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x179670);
  puVar27 = local_1e0;
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  psVar19 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_220.field_2._M_allocated_capacity = *psVar19;
    local_220.field_2._8_8_ = plVar14[3];
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar19;
    local_220._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_220._M_string_length = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_220);
  pPVar23 = (Path *)(plVar14 + 2);
  if ((Path *)*plVar14 == pPVar23) {
    local_268._16_8_ =
         (pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
         _M_impl.super__Vector_impl_data._M_start;
    local_268._24_8_ = plVar14[3];
    local_268._0_8_ = pPVar25;
  }
  else {
    local_268._16_8_ =
         (pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
         _M_impl.super__Vector_impl_data._M_start;
    local_268._0_8_ = (Path *)*plVar14;
  }
  local_268._8_8_ = plVar14[1];
  *plVar14 = (long)pPVar23;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  uVar7 = *puVar27;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_0015135d;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_0015135d;
      }
      if (uVar18 < 10000) goto LAB_0015135d;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_0015135d:
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_1d8),uVar31,uVar9);
  puVar27 = local_1e0;
  pIVar3 = (pointer)((long)&(((_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               *)local_268._8_8_)->_M_impl).super__Vector_impl_data._M_start +
                    local_1d0);
  pIVar28 = (pointer)0xf;
  if ((Path *)local_268._0_8_ != pPVar25) {
    pIVar28 = (pointer)local_268._16_8_;
  }
  if (pIVar28 < pIVar3) {
    pIVar28 = (pointer)0xf;
    if (local_1d8 != &local_1c8) {
      pIVar28 = local_1c8;
    }
    if (pIVar28 < pIVar3) goto LAB_001513fb;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,local_268._0_8_);
  }
  else {
LAB_001513fb:
    puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_268,(ulong)local_1d8);
  }
  psVar19 = puVar15 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_240.field_2._M_allocated_capacity = *psVar19;
    local_240.field_2._8_8_ = puVar15[3];
    local_240._M_dataplus._M_p = (pointer)paVar30;
  }
  else {
    local_240.field_2._M_allocated_capacity = *psVar19;
    local_240._M_dataplus._M_p = (pointer)*puVar15;
  }
  local_240._M_string_length = puVar15[1];
  *puVar15 = psVar19;
  puVar15[1] = 0;
  *(undefined1 *)psVar19 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_240);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_140._16_8_ = *psVar19;
    local_140._24_8_ = plVar14[3];
    local_140._0_8_ = local_140 + 0x10;
  }
  else {
    local_140._16_8_ = *psVar19;
    local_140._0_8_ = (size_type *)*plVar14;
  }
  local_140._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar30) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,(ulong)((long)&local_1c8->X + 1));
  }
  if ((Path *)local_268._0_8_ != pPVar25) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  uVar7 = *puVar27;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_001515c3;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_001515c3;
      }
      if (uVar18 < 10000) goto LAB_001515c3;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_001515c3:
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_220,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_220._M_dataplus._M_p + (uVar7 >> 0x1f),uVar31,uVar9);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,0x179670);
  puVar27 = local_1e0;
  pPVar23 = (Path *)(plVar14 + 2);
  paVar4 = &local_200.field_2;
  if ((Path *)*plVar14 == pPVar23) {
    local_268._16_8_ =
         (pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
         _M_impl.super__Vector_impl_data._M_start;
    local_268._24_8_ = plVar14[3];
    local_268._0_8_ = pPVar25;
  }
  else {
    local_268._16_8_ =
         (pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
         _M_impl.super__Vector_impl_data._M_start;
    local_268._0_8_ = (Path *)*plVar14;
  }
  local_268._8_8_ = plVar14[1];
  *plVar14 = (long)pPVar23;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_268);
  puVar22 = (ulong *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar22) {
    local_240.field_2._M_allocated_capacity = *puVar22;
    local_240.field_2._8_8_ = plVar14[3];
    local_240._M_dataplus._M_p = (pointer)paVar30;
  }
  else {
    local_240.field_2._M_allocated_capacity = *puVar22;
    local_240._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_240._M_string_length = plVar14[1];
  *plVar14 = (long)puVar22;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  uVar7 = *puVar27;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_0015170a;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_0015170a;
      }
      if (uVar18 < 10000) goto LAB_0015170a;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_0015170a:
  local_200._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct((ulong)&local_200,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_200._M_dataplus._M_p + (uVar7 >> 0x1f),uVar31,uVar9);
  puVar27 = local_1e0;
  uVar29 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar30) {
    uVar29 = local_240.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar29 < local_200._M_string_length + local_240._M_string_length) {
    uVar29 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar4) {
      uVar29 = local_200.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar29 < local_200._M_string_length + local_240._M_string_length) goto LAB_0015178a;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_200,0,(char *)0x0,(ulong)local_240._M_dataplus._M_p);
  }
  else {
LAB_0015178a:
    puVar15 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_200._M_dataplus._M_p);
  }
  psVar19 = puVar15 + 2;
  if ((size_type *)*puVar15 == psVar19) {
    local_140._16_8_ = *psVar19;
    local_140._24_8_ = puVar15[3];
    local_140._0_8_ = local_140 + 0x10;
  }
  else {
    local_140._16_8_ = *psVar19;
    local_140._0_8_ = (size_type *)*puVar15;
  }
  local_140._8_8_ = puVar15[1];
  *puVar15 = psVar19;
  puVar15[1] = 0;
  *(undefined1 *)psVar19 = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar4) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar30) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((Path *)local_268._0_8_ != pPVar25) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if (*(int *)local_148 != 3) {
    return;
  }
  uVar7 = *puVar27;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_001518ed;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_001518ed;
      }
      if (uVar18 < 10000) goto LAB_001518ed;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_001518ed:
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct((ulong)local_140,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_140._0_8_ + (ulong)(uVar7 >> 0x1f)),uVar31,uVar9);
  plVar14 = (long *)std::__cxx11::string::append(local_140);
  pPVar12 = local_40;
  psVar19 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_240.field_2._M_allocated_capacity = *psVar19;
    local_240.field_2._8_8_ = plVar14[3];
    local_240._M_dataplus._M_p = (pointer)paVar30;
  }
  else {
    local_240.field_2._M_allocated_capacity = *psVar19;
    local_240._M_dataplus._M_p = (pointer)*plVar14;
  }
  pcVar5 = local_140 + 0x10;
  local_240._M_string_length = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((pointer)local_140._0_8_ != pcVar5) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                 "    additive_ingredients_",&local_240);
  plVar14 = (long *)std::__cxx11::string::append(local_268);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_140._16_8_ = *psVar19;
    local_140._24_8_ = plVar14[3];
    local_140._0_8_ = pcVar5;
  }
  else {
    local_140._16_8_ = *psVar19;
    local_140._0_8_ = (size_type *)*plVar14;
  }
  local_140._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  if ((pointer)local_140._0_8_ != pcVar5) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((Path *)local_268._0_8_ != pPVar25) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  pvVar26 = (pPVar12->
            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_148 = (pPVar12->
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar26 != local_148) {
    pmVar2 = &local_190->etch_contour_map;
    pmVar1 = &local_190->proc_info_map;
    do {
      local_268._0_8_ = (Path *)0x0;
      local_268._8_8_ = (pointer)0x0;
      local_268._16_8_ = (pointer)0x0;
      ClipperLib::ClipperOffset::ClipperOffset((ClipperOffset *)local_140,2.0,0.25);
      ClipperLib::ClipperOffset::Clear((ClipperOffset *)local_140);
      ClipperLib::ClipperOffset::AddPath
                ((ClipperOffset *)local_140,pvVar26,jtSquare,etClosedPolygon);
      pmVar16 = std::
                map<int,_std::vector<GEO::point,_std::allocator<GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>_>_>
                ::operator[](pmVar2,(key_type *)local_1e0);
      ClipperLib::ClipperOffset::Execute
                ((ClipperOffset *)local_140,(Paths *)local_268,
                 (pmVar16->super__Vector_base<GEO::point,_std::allocator<GEO::point>_>)._M_impl.
                 super__Vector_impl_data._M_finish[-1].x);
      uVar29 = local_268._0_8_;
      local_1d8 = (pointer *)CONCAT71(local_1d8._1_7_,1);
      pmVar17 = std::
                map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
                ::operator[](pmVar1,(key_type *)local_1e0);
      local_220._M_dataplus._M_p._0_4_ = pmVar17->z_start + -9;
      local_200._M_dataplus._M_p._0_4_ = 8;
      push_freecad_prism(local_190,(Path *)uVar29,(bool *)&local_1d8,(int *)&local_220,
                         (int *)&local_200,&local_240);
      ClipperLib::ClipperOffset::~ClipperOffset((ClipperOffset *)local_140);
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 *)local_268);
      pvVar26 = pvVar26 + 1;
    } while (pvVar26 != local_148);
  }
  build_additive_sub_layer(local_190,&local_240);
  uVar7 = *local_1e0;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_00151be8;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_00151be8;
      }
      if (uVar18 < 10000) goto LAB_00151be8;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_00151be8:
  local_168 = local_158;
  std::__cxx11::string::_M_construct((ulong)&local_168,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_168),uVar31,uVar9);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x179653);
  pPVar25 = (Path *)(local_268 + 0x10);
  local_188 = &local_178;
  puVar22 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar22) {
    local_178 = *puVar22;
    lStack_170 = plVar14[3];
  }
  else {
    local_178 = *puVar22;
    local_188 = (ulong *)*plVar14;
  }
  local_180 = plVar14[1];
  *plVar14 = (long)puVar22;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_188);
  puVar22 = (ulong *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar22) {
    local_1b0.field_2._M_allocated_capacity = *puVar22;
    local_1b0.field_2._8_8_ = plVar14[3];
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *puVar22;
    local_1b0._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_1b0._M_string_length = plVar14[1];
  *plVar14 = (long)puVar22;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  ppIVar21 = (pointer *)(plVar14 + 2);
  if ((pointer *)*plVar14 == ppIVar21) {
    local_1c8 = *ppIVar21;
    lStack_1c0 = plVar14[3];
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = *ppIVar21;
    local_1d8 = (pointer *)*plVar14;
  }
  local_1d0 = plVar14[1];
  *plVar14 = (long)ppIVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_1d8,(ulong)local_240._M_dataplus._M_p);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_200.field_2._M_allocated_capacity = *psVar19;
    local_200.field_2._8_8_ = plVar14[3];
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar19;
    local_200._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_200._M_string_length = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_200);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_220.field_2._M_allocated_capacity = *psVar19;
    local_220.field_2._8_8_ = plVar14[3];
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar19;
    local_220._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_220._M_string_length = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_220,(ulong)local_240._M_dataplus._M_p);
  pPVar23 = (Path *)(plVar14 + 2);
  if ((Path *)*plVar14 == pPVar23) {
    local_268._16_8_ =
         (pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
         _M_impl.super__Vector_impl_data._M_start;
    local_268._24_8_ = plVar14[3];
    local_268._0_8_ = pPVar25;
  }
  else {
    local_268._16_8_ =
         (pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
         _M_impl.super__Vector_impl_data._M_start;
    local_268._0_8_ = (Path *)*plVar14;
  }
  local_268._8_8_ = plVar14[1];
  *plVar14 = (long)pPVar23;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_268);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_140._16_8_ = *psVar19;
    local_140._24_8_ = plVar14[3];
    local_140._0_8_ = local_140 + 0x10;
  }
  else {
    local_140._16_8_ = *psVar19;
    local_140._0_8_ = (size_type *)*plVar14;
  }
  local_140._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((Path *)local_268._0_8_ != pPVar25) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,(ulong)((long)&local_1c8->X + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  puVar27 = local_1e0;
  if (local_188 != &local_178) {
    operator_delete(local_188,local_178 + 1);
  }
  if (local_168 != local_158) {
    operator_delete(local_168,(ulong)((long)&local_158[0]->X + 1));
  }
  uVar7 = *puVar27;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_0015201f;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_0015201f;
      }
      if (uVar18 < 10000) goto LAB_0015201f;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_0015201f:
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_1d8),uVar31,uVar9);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x179670);
  puVar27 = local_1e0;
  psVar19 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_200.field_2._M_allocated_capacity = *psVar19;
    local_200.field_2._8_8_ = plVar14[3];
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar19;
    local_200._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_200._M_string_length = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_200);
  puVar22 = (ulong *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar22) {
    local_220.field_2._M_allocated_capacity = *puVar22;
    local_220.field_2._8_8_ = plVar14[3];
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *puVar22;
    local_220._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_220._M_string_length = plVar14[1];
  *plVar14 = (long)puVar22;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  uVar7 = *puVar27;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_0015216f;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_0015216f;
      }
      if (uVar18 < 10000) goto LAB_0015216f;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_0015216f:
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1b0,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1b0._M_dataplus._M_p + (uVar7 >> 0x1f),uVar31,uVar9);
  uVar29 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    uVar29 = local_220.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar29 < local_1b0._M_string_length + local_220._M_string_length) {
    uVar29 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      uVar29 = local_1b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar29 < local_1b0._M_string_length + local_220._M_string_length) goto LAB_00152206;
    plVar14 = (long *)std::__cxx11::string::replace
                                ((ulong)&local_1b0,0,(char *)0x0,(ulong)local_220._M_dataplus._M_p);
  }
  else {
LAB_00152206:
    plVar14 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_220,(ulong)local_1b0._M_dataplus._M_p);
  }
  pPVar23 = (Path *)(plVar14 + 2);
  if ((Path *)*plVar14 == pPVar23) {
    local_268._16_8_ =
         (pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
         _M_impl.super__Vector_impl_data._M_start;
    local_268._24_8_ = plVar14[3];
    local_268._0_8_ = pPVar25;
  }
  else {
    local_268._16_8_ =
         (pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
         _M_impl.super__Vector_impl_data._M_start;
    local_268._0_8_ = (Path *)*plVar14;
  }
  local_268._8_8_ = plVar14[1];
  *plVar14 = (long)pPVar23;
  plVar14[1] = 0;
  *(undefined1 *)
   &(pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
    _M_impl.super__Vector_impl_data._M_start = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_268);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_140._16_8_ = *psVar19;
    local_140._24_8_ = plVar14[3];
    local_140._0_8_ = local_140 + 0x10;
  }
  else {
    local_140._16_8_ = *psVar19;
    local_140._0_8_ = (size_type *)*plVar14;
  }
  local_140._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((Path *)local_268._0_8_ != pPVar25) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  puVar27 = local_1e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,(ulong)((long)&local_1c8->X + 1));
  }
  uVar7 = *puVar27;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_001523d4;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_001523d4;
      }
      if (uVar18 < 10000) goto LAB_001523d4;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_001523d4:
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar7 >> 0x1f) + (long)local_1d8),uVar31,uVar9);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x179670);
  puVar27 = local_1e0;
  psVar19 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_200.field_2._M_allocated_capacity = *psVar19;
    local_200.field_2._8_8_ = plVar14[3];
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar19;
    local_200._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_200._M_string_length = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_200);
  puVar22 = (ulong *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar22) {
    local_220.field_2._M_allocated_capacity = *puVar22;
    local_220.field_2._8_8_ = plVar14[3];
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = *puVar22;
    local_220._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_220._M_string_length = plVar14[1];
  *plVar14 = (long)puVar22;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  uVar7 = *puVar27;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_00152524;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_00152524;
      }
      if (uVar18 < 10000) goto LAB_00152524;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_00152524:
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1b0,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1b0._M_dataplus._M_p + (uVar7 >> 0x1f),uVar31,uVar9);
  uVar29 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    uVar29 = local_220.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar29 < local_1b0._M_string_length + local_220._M_string_length) {
    uVar29 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      uVar29 = local_1b0.field_2._M_allocated_capacity;
    }
    if (local_1b0._M_string_length + local_220._M_string_length <= (ulong)uVar29) {
      plVar14 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_1b0,0,(char *)0x0,(ulong)local_220._M_dataplus._M_p
                                  );
      goto LAB_001525d8;
    }
  }
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_220,(ulong)local_1b0._M_dataplus._M_p);
LAB_001525d8:
  pPVar23 = (Path *)(plVar14 + 2);
  if ((Path *)*plVar14 == pPVar23) {
    local_268._16_8_ =
         (pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
         _M_impl.super__Vector_impl_data._M_start;
    local_268._24_8_ = plVar14[3];
    local_268._0_8_ = pPVar25;
  }
  else {
    local_268._16_8_ =
         (pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
         _M_impl.super__Vector_impl_data._M_start;
    local_268._0_8_ = (Path *)*plVar14;
  }
  local_268._8_8_ = plVar14[1];
  *plVar14 = (long)pPVar23;
  plVar14[1] = 0;
  *(undefined1 *)
   &(pPVar23->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
    _M_impl.super__Vector_impl_data._M_start = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_268);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_140._16_8_ = *psVar19;
    local_140._24_8_ = plVar14[3];
    local_140._0_8_ = local_140 + 0x10;
  }
  else {
    local_140._16_8_ = *psVar19;
    local_140._0_8_ = (size_type *)*plVar14;
  }
  local_140._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((Path *)local_268._0_8_ != pPVar25) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  puVar27 = local_1e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,(ulong)((long)&local_1c8->X + 1));
  }
  uVar7 = *puVar27;
  uVar9 = -uVar7;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar31 = 1;
  if (9 < uVar9) {
    uVar24 = (ulong)uVar9;
    uVar13 = 4;
    do {
      uVar31 = uVar13;
      uVar18 = (uint)uVar24;
      if (uVar18 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_00152789;
      }
      if (uVar18 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_00152789;
      }
      if (uVar18 < 10000) goto LAB_00152789;
      uVar24 = uVar24 / 10000;
      uVar13 = uVar31 + 4;
    } while (99999 < uVar18);
    uVar31 = uVar31 + 1;
  }
LAB_00152789:
  local_268._0_8_ = pPVar25;
  std::__cxx11::string::_M_construct((ulong)local_268,(char)uVar31 - (char)((int)uVar7 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_268._0_8_ + (ulong)(uVar7 >> 0x1f)),uVar31,uVar9);
  plVar14 = (long *)std::__cxx11::string::append(local_268);
  pPVar12 = local_40;
  pcVar5 = local_140 + 0x10;
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_140._16_8_ = *psVar19;
    local_140._24_8_ = plVar14[3];
    local_140._0_8_ = pcVar5;
  }
  else {
    local_140._16_8_ = *psVar19;
    local_140._0_8_ = (size_type *)*plVar14;
  }
  local_140._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_240,(string *)local_140);
  if ((pointer)local_140._0_8_ != pcVar5) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((Path *)local_268._0_8_ != pPVar25) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                 "    additive_ingredients_",&local_240);
  plVar14 = (long *)std::__cxx11::string::append(local_268);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_140._16_8_ = *psVar19;
    local_140._24_8_ = plVar14[3];
    local_140._0_8_ = pcVar5;
  }
  else {
    local_140._16_8_ = *psVar19;
    local_140._0_8_ = (size_type *)*plVar14;
  }
  local_140._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  if ((pointer)local_140._0_8_ != pcVar5) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((Path *)local_268._0_8_ != pPVar25) {
    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
  }
  pvVar26 = (pPVar12->
            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pvVar26 != local_148) {
    pmVar2 = &local_190->etch_contour_map;
    pmVar1 = &local_190->proc_info_map;
    do {
      local_268._0_8_ = (Path *)0x0;
      local_268._8_8_ = (pointer)0x0;
      local_268._16_8_ = (pointer)0x0;
      ClipperLib::ClipperOffset::ClipperOffset((ClipperOffset *)local_140,2.0,0.25);
      ClipperLib::ClipperOffset::Clear((ClipperOffset *)local_140);
      ClipperLib::ClipperOffset::AddPath
                ((ClipperOffset *)local_140,pvVar26,jtSquare,etClosedPolygon);
      pmVar16 = std::
                map<int,_std::vector<GEO::point,_std::allocator<GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>_>_>
                ::operator[](pmVar2,(key_type *)local_1e0);
      ClipperLib::ClipperOffset::Execute
                ((ClipperOffset *)local_140,(Paths *)local_268,
                 (pmVar16->super__Vector_base<GEO::point,_std::allocator<GEO::point>_>)._M_impl.
                 super__Vector_impl_data._M_finish[-1].x);
      uVar29 = local_268._0_8_;
      local_1d8 = (pointer *)CONCAT71(local_1d8._1_7_,1);
      pmVar17 = std::
                map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
                ::operator[](pmVar1,(key_type *)local_1e0);
      local_220._M_dataplus._M_p._0_4_ = pmVar17->z_start + -1;
      local_200._M_dataplus._M_p._0_4_ = 1;
      push_freecad_prism(local_190,(Path *)uVar29,(bool *)&local_1d8,(int *)&local_220,
                         (int *)&local_200,&local_240);
      ClipperLib::ClipperOffset::~ClipperOffset((ClipperOffset *)local_140);
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 *)local_268);
      pvVar26 = pvVar26 + 1;
    } while (pvVar26 != local_148);
  }
  build_additive_sub_layer(local_190,&local_240);
  std::operator+(&local_1b0,"    layer_",&local_240);
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  paVar30 = &local_220.field_2;
  pcVar6 = local_140 + 0x10;
  ppIVar21 = (pointer *)(plVar14 + 2);
  pcVar5 = local_268 + 0x10;
  if ((pointer *)*plVar14 == ppIVar21) {
    local_1c8 = *ppIVar21;
    lStack_1c0 = plVar14[3];
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = *ppIVar21;
    local_1d8 = (pointer *)*plVar14;
  }
  local_1d0 = plVar14[1];
  *plVar14 = (long)ppIVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_1d8,(ulong)local_240._M_dataplus._M_p);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  psVar19 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_200.field_2._M_allocated_capacity = *psVar19;
    local_200.field_2._8_8_ = plVar14[3];
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar19;
    local_200._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_200._M_string_length = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_200);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_220.field_2._M_allocated_capacity = *psVar19;
    local_220.field_2._8_8_ = plVar14[3];
    local_220._M_dataplus._M_p = (pointer)paVar30;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar19;
    local_220._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_220._M_string_length = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_220,(ulong)local_240._M_dataplus._M_p);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_268._16_8_ = *psVar19;
    local_268._24_8_ = plVar14[3];
    local_268._0_8_ = pcVar5;
  }
  else {
    local_268._16_8_ = *psVar19;
    local_268._0_8_ = (size_type *)*plVar14;
  }
  local_268._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_268);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_140._16_8_ = *psVar19;
    local_140._24_8_ = plVar14[3];
    local_140._0_8_ = pcVar6;
  }
  else {
    local_140._16_8_ = *psVar19;
    local_140._0_8_ = (size_type *)*plVar14;
  }
  local_140._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  if ((pointer)local_140._0_8_ != pcVar6) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((pointer)local_268._0_8_ != pcVar5) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar30) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,(ulong)((long)&local_1c8->X + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_200,"    lyr_",&local_240);
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_200);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_220.field_2._M_allocated_capacity = *psVar19;
    local_220.field_2._8_8_ = plVar14[3];
    local_220._M_dataplus._M_p = (pointer)paVar30;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar19;
    local_220._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_220._M_string_length = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_220,(ulong)local_240._M_dataplus._M_p);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_268._16_8_ = *psVar19;
    local_268._24_8_ = plVar14[3];
    local_268._0_8_ = pcVar5;
  }
  else {
    local_268._16_8_ = *psVar19;
    local_268._0_8_ = (size_type *)*plVar14;
  }
  local_268._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_268);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_140._16_8_ = *psVar19;
    local_140._24_8_ = plVar14[3];
    local_140._0_8_ = pcVar6;
  }
  else {
    local_140._16_8_ = *psVar19;
    local_140._0_8_ = (size_type *)*plVar14;
  }
  local_140._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  if ((pointer)local_140._0_8_ != pcVar6) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((pointer)local_268._0_8_ != pcVar5) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar30) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_220,"    lyr_",&local_240);
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_220);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_268._16_8_ = *psVar19;
    local_268._24_8_ = plVar14[3];
    local_268._0_8_ = pcVar5;
  }
  else {
    local_268._16_8_ = *psVar19;
    local_268._0_8_ = (size_type *)*plVar14;
  }
  local_268._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append(local_268,(ulong)local_240._M_dataplus._M_p);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar19) {
    local_140._16_8_ = *psVar19;
    local_140._24_8_ = plVar14[3];
    local_140._0_8_ = pcVar6;
  }
  else {
    local_140._16_8_ = *psVar19;
    local_140._0_8_ = (size_type *)*plVar14;
  }
  local_140._8_8_ = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  if ((pointer)local_140._0_8_ != pcVar6) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if ((pointer)local_268._0_8_ != pcVar5) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar30) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MODEL3D::three_dim_model::generate_freecad_solid(
const ClipperLib::Paths &primary,
const ClipperLib::Paths &secondary,
const bool &has_holes,
const int &layer_number,
const int &mask_type)
{
  // Create the list of additive shapes
    py_script.push_back("    additive_ingredients_"+std::to_string(layer_number)+" = []");
    auto primary_end = primary.end();
    for (auto primary_it = primary.begin();
         primary_it != primary_end;
         primary_it++)
    {
        bool bot_strt = false;//type 0 and 3
        double o_f = additive_overlap_factor;
        if(mask_type==1)// 0 = Standard /^##^\ , 1 = Inverted \_##_/
            bot_strt = true;
        // // Don't overlap on the counter-electrode layer or layer 55 because
        // // layers with circular shapes bug out in the fuse operation of
        // // create_pss. TODO: Still looking for a solution to this.
        // // Layer 51 and 55 have circular shapes
        if((mask_type==3)/*||(layer_number==55)*/)
            o_f = 1;
        push_freecad_pss(*primary_it, bot_strt, layer_number, true, o_f);
    }
    // Build them in python as a list
    build_additive_shapes(layer_number, true);
    // Execute the boolean fuse
    py_script.push_back("    additive_fuse_"    //taking first element of the list
    +std::to_string(layer_number)
    +"= additives_"+std::to_string(layer_number)
    +"[0]");
    py_script.push_back("    additive_fuse_"
    +std::to_string(layer_number)
    +" = additive_fuse_"
    +std::to_string(layer_number)
    +".fuse(additives_"+std::to_string(layer_number)+")");
    // Create a list of subtractive shapes if they exist
    if(secondary.size()>0)
    {
        py_script.push_back("    subtractive_ingredients_"+std::to_string(layer_number)+" = []");
        auto secondary_end = secondary.end();
        for (auto secondary_it = secondary.begin();
            secondary_it != secondary_end;
            secondary_it++)
        {
            bool bot_strt = true;// swapped around from above because placing back
            if(mask_type==1)// 0 = Standard /^##^\ , 1 = Inverted \_##_/
                bot_strt = false;
            push_freecad_pss(*secondary_it, bot_strt, layer_number, false, subtractive_overlap_factor);
        }
        // Build subtractive shapes in python as a list
        build_subtractive_shapes(layer_number);
        // Execute the boolean cut and name it layer
        py_script.push_back("    subtractive_cut_"
        +std::to_string(layer_number)
        +"= additive_fuse_"
        +std::to_string(layer_number)
        +".cut(subtractives_"
        +std::to_string(layer_number)+")");
        py_script.push_back("layer_"
        +std::to_string(layer_number)
        +" = subtractive_cut_"
        + std::to_string(layer_number));
    }
    else// Otherwise name the layer boolean fuse
    {
        py_script.push_back("    layer_"
        +std::to_string(layer_number)
        +"=additive_fuse_"
        +std::to_string(layer_number));
    }
    // py_script.push_back("    Part.show(layer_"
    // +std::to_string(layer_number)+")");
    py_script.push_back("    lyr_"
    +std::to_string(layer_number)+" = My_doc.addObject(\"Part::Feature\",\"layer_"
    +std::to_string(layer_number)+"\")");
    py_script.push_back("    lyr_"+std::to_string(layer_number)
    +".Shape = layer_"+std::to_string(layer_number));
    // Extra work for junction layer case
    if(mask_type==3)
    {
        // Create list of all Al shapes.
        std::string sub_layer = std::to_string(layer_number)+"_Al";
        py_script.push_back("    additive_ingredients_"+sub_layer+" = []");
        auto primary_end = primary.end();
        for (auto primary_it = primary.begin();
            primary_it != primary_end;
            primary_it++)
        {
            //offset the path in question by the contour-width to make flush with counter-electrode
            ClipperLib::Paths adjusted_paths;
            ClipperLib::ClipperOffset co;
            co.Clear();
            co.AddPath(*primary_it, ClipperLib::jtSquare, ClipperLib::etClosedPolygon);
            double offset_value = std::prev(etch_contour_map[layer_number].end(),1)->x;
            co.Execute(adjusted_paths, offset_value);
            push_freecad_prism( adjusted_paths[0],
                                true,
                                (proc_info_map[layer_number].z_start-9), 8, sub_layer);
        }
        // Generate all Al shapes
        build_additive_sub_layer(sub_layer);
        // Merge all AL shapes into sub-layer
        py_script.push_back("    layer_"+std::to_string(layer_number)+"_Al = "+
        "additives_"+sub_layer+"[0].fuse(additives_"+sub_layer+")");
        // py_script.push_back("    Part.show(Layer_"+std::to_string(layer_number)+"_Al)");
        py_script.push_back("    lyr_"
        +std::to_string(layer_number)+"_Al = My_doc.addObject(\"Part::Feature\",\"layer_"
        +std::to_string(layer_number)+"_Al\")");
        py_script.push_back("    lyr_"+std::to_string(layer_number)
        +"_Al.Shape = layer_"+std::to_string(layer_number)+"_Al");
        // Create list of all AlOX shapes
        sub_layer = std::to_string(layer_number)+"_AlOx";
        py_script.push_back("    additive_ingredients_"+sub_layer+" = []");
        for (auto primary_it = primary.begin();
            primary_it != primary_end;
            primary_it++)
        {
            ClipperLib::Paths adjusted_paths;
            ClipperLib::ClipperOffset co;
            co.Clear();
            co.AddPath(*primary_it, ClipperLib::jtSquare, ClipperLib::etClosedPolygon);
            double offset_value = std::prev(etch_contour_map[layer_number].end(),1)->x;
            co.Execute(adjusted_paths, offset_value);
            push_freecad_prism( adjusted_paths[0],
                                true,
                                (proc_info_map[layer_number].z_start-1), 1, sub_layer);
        }
        // Generate all AlOx shapes
        build_additive_sub_layer(sub_layer);
        // Merge AlOx shapes into sub-layer
        py_script.push_back("    layer_"+sub_layer+" = additives_"
        +sub_layer+"[0].fuse(additives_"+sub_layer+")");
        //py_script.push_back("    Part.show(Layer_" + sub_layer + ")");
        py_script.push_back("    lyr_"
        +sub_layer+" = My_doc.addObject(\"Part::Feature\",\"layer_"
        +sub_layer+"\")");
        py_script.push_back("    lyr_"+sub_layer
        +".Shape = layer_"+sub_layer);
    }
}